

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O1

void create_colorindex(j_decompress_ptr cinfo)

{
  J_DITHER_MODE JVar1;
  int iVar2;
  jpeg_color_quantizer *pjVar3;
  undefined1 *puVar4;
  int iVar5;
  JSAMPARRAY ppJVar6;
  long lVar7;
  undefined1 *puVar8;
  JDIMENSION JVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  
  pjVar3 = cinfo->cquantize;
  JVar1 = cinfo->dither_mode;
  JVar9 = 0x100;
  if (JVar1 == JDITHER_ORDERED) {
    JVar9 = 0x2fe;
  }
  *(uint *)&pjVar3[1].new_color_map = (uint)(JVar1 == JDITHER_ORDERED);
  ppJVar6 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,JVar9,cinfo->out_color_components);
  pjVar3[1].finish_pass = (_func_void_j_decompress_ptr *)ppJVar6;
  if (0 < cinfo->out_color_components) {
    iVar5 = *(int *)&pjVar3[1].color_quantize;
    lVar11 = 0;
    do {
      iVar2 = *(int *)((long)&pjVar3[1].new_color_map + lVar11 * 4 + 4);
      iVar5 = iVar5 / iVar2;
      if (JVar1 == JDITHER_ORDERED) {
        *(long *)(pjVar3[1].finish_pass + lVar11 * 8) =
             *(long *)(pjVar3[1].finish_pass + lVar11 * 8) + 0xff;
      }
      puVar4 = *(undefined1 **)(pjVar3[1].finish_pass + lVar11 * 8);
      lVar12 = (long)(iVar2 * 2 + -2);
      lVar7 = ((long)iVar2 + 0xfe) / lVar12;
      lVar13 = 0;
      iVar14 = 0;
      do {
        if ((int)lVar7 < lVar13) {
          lVar10 = (long)iVar14 * 0x1fe + (long)iVar2 + 0x2fc;
          do {
            lVar7 = lVar10 / lVar12;
            iVar14 = iVar14 + 1;
            lVar10 = lVar10 + 0x1fe;
          } while ((int)lVar7 < lVar13);
        }
        puVar4[lVar13] = (char)iVar14 * (char)iVar5;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x100);
      if (JVar1 == JDITHER_ORDERED) {
        lVar7 = 0x100;
        puVar8 = puVar4;
        do {
          puVar8 = puVar8 + -1;
          *puVar8 = *puVar4;
          puVar4[lVar7] = puVar4[0xff];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x1ff);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < cinfo->out_color_components);
  }
  return;
}

Assistant:

LOCAL(void)
create_colorindex(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  JSAMPROW indexptr;
  int i, j, k, nci, blksize, val, pad;

  /* For ordered dither, we pad the color index tables by MAXJSAMPLE in
   * each direction (input index values can be -MAXJSAMPLE .. 2*MAXJSAMPLE).
   * This is not necessary in the other dithering modes.  However, we
   * flag whether it was done in case user changes dithering mode.
   */
  if (cinfo->dither_mode == JDITHER_ORDERED) {
    pad = MAXJSAMPLE * 2;
    cquantize->is_padded = TRUE;
  } else {
    pad = 0;
    cquantize->is_padded = FALSE;
  }

  cquantize->colorindex = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)(MAXJSAMPLE + 1 + pad),
     (JDIMENSION)cinfo->out_color_components);

  /* blksize is number of adjacent repeated entries for a component */
  blksize = cquantize->sv_actual;

  for (i = 0; i < cinfo->out_color_components; i++) {
    /* fill in colorindex entries for i'th color component */
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    blksize = blksize / nci;

    /* adjust colorindex pointers to provide padding at negative indexes. */
    if (pad)
      cquantize->colorindex[i] += MAXJSAMPLE;

    /* in loop, val = index of current output value, */
    /* and k = largest j that maps to current val */
    indexptr = cquantize->colorindex[i];
    val = 0;
    k = largest_input_value(cinfo, i, 0, nci - 1);
    for (j = 0; j <= MAXJSAMPLE; j++) {
      while (j > k)             /* advance val if past boundary */
        k = largest_input_value(cinfo, i, ++val, nci - 1);
      /* premultiply so that no multiplication needed in main processing */
      indexptr[j] = (JSAMPLE)(val * blksize);
    }
    /* Pad at both ends if necessary */
    if (pad)
      for (j = 1; j <= MAXJSAMPLE; j++) {
        indexptr[-j] = indexptr[0];
        indexptr[MAXJSAMPLE + j] = indexptr[MAXJSAMPLE];
      }
  }
}